

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall QPDF::replaceObject(QPDF *this,int objid,int generation,QPDFObjectHandle *oh)

{
  QPDFObjectHandle local_38;
  QPDFObjGen local_28;
  QPDFObjectHandle *local_20;
  QPDFObjectHandle *oh_local;
  int generation_local;
  int objid_local;
  QPDF *this_local;
  
  local_20 = oh;
  oh_local._0_4_ = generation;
  oh_local._4_4_ = objid;
  _generation_local = this;
  QPDFObjGen::QPDFObjGen(&local_28,objid,generation);
  QPDFObjectHandle::QPDFObjectHandle(&local_38,oh);
  replaceObject(this,local_28,&local_38);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  return;
}

Assistant:

void
QPDF::replaceObject(int objid, int generation, QPDFObjectHandle oh)
{
    replaceObject(QPDFObjGen(objid, generation), oh);
}